

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

void aom_flat_block_finder_extract_block
               (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,int offsx
               ,int offsy,double *plane,double *block)

{
  uint uVar1;
  double *m1;
  double *m2;
  uint inner_dim;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  double AtA_inv_b [3];
  double plane_coords [3];
  
  uVar1 = block_finder->block_size;
  inner_dim = uVar1 * uVar1;
  m1 = block_finder->AtA_inv;
  m2 = block_finder->A;
  iVar7 = h + -1;
  iVar6 = w + -1;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  if (block_finder->use_highbd == 0) {
    pdVar8 = block;
    for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
      lVar3 = (long)offsy + uVar10;
      iVar9 = (int)lVar3;
      iVar5 = iVar7;
      if (iVar9 < iVar7) {
        iVar5 = iVar9;
      }
      if (lVar3 < 0) {
        iVar5 = 0;
      }
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        iVar9 = offsx + (int)uVar4;
        if (iVar6 <= iVar9) {
          iVar9 = iVar6;
        }
        if ((long)((long)offsx + uVar4) < 0) {
          iVar9 = 0;
        }
        pdVar8[uVar4] = (double)data[iVar9 + iVar5 * stride] / block_finder->normalization;
      }
      pdVar8 = pdVar8 + (int)uVar1;
    }
  }
  else {
    pdVar8 = block;
    for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
      lVar3 = (long)offsy + uVar10;
      iVar9 = (int)lVar3;
      iVar5 = iVar7;
      if (iVar9 < iVar7) {
        iVar5 = iVar9;
      }
      if (lVar3 < 0) {
        iVar5 = 0;
      }
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        iVar9 = offsx + (int)uVar4;
        if (iVar6 <= iVar9) {
          iVar9 = iVar6;
        }
        if ((long)((long)offsx + uVar4) < 0) {
          iVar9 = 0;
        }
        pdVar8[uVar4] =
             (double)*(ushort *)(data + (long)(iVar9 + iVar5 * stride) * 2) /
             block_finder->normalization;
      }
      pdVar8 = pdVar8 + (int)uVar1;
    }
  }
  multiply_mat(block,m2,AtA_inv_b,1,inner_dim,3);
  multiply_mat(m1,AtA_inv_b,plane_coords,3,3,1);
  multiply_mat(m2,plane_coords,plane,inner_dim,3,1);
  for (uVar2 = 0; inner_dim != uVar2; uVar2 = uVar2 + 1) {
    block[uVar2] = block[uVar2] - plane[uVar2];
  }
  return;
}

Assistant:

void aom_flat_block_finder_extract_block(
    const aom_flat_block_finder_t *block_finder, const uint8_t *const data,
    int w, int h, int stride, int offsx, int offsy, double *plane,
    double *block) {
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double *A = block_finder->A;
  const double *AtA_inv = block_finder->AtA_inv;
  double plane_coords[kLowPolyNumParams];
  double AtA_inv_b[kLowPolyNumParams];
  int xi, yi, i;

  if (block_finder->use_highbd) {
    const uint16_t *const data16 = (const uint16_t *const)data;
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data16[y * stride + x]) / block_finder->normalization;
      }
    }
  } else {
    for (yi = 0; yi < block_size; ++yi) {
      const int y = clamp(offsy + yi, 0, h - 1);
      for (xi = 0; xi < block_size; ++xi) {
        const int x = clamp(offsx + xi, 0, w - 1);
        block[yi * block_size + xi] =
            ((double)data[y * stride + x]) / block_finder->normalization;
      }
    }
  }
  multiply_mat(block, A, AtA_inv_b, 1, n, kLowPolyNumParams);
  multiply_mat(AtA_inv, AtA_inv_b, plane_coords, kLowPolyNumParams,
               kLowPolyNumParams, 1);
  multiply_mat(A, plane_coords, plane, n, kLowPolyNumParams, 1);

  for (i = 0; i < n; ++i) {
    block[i] -= plane[i];
  }
}